

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvstore.cpp
# Opt level: O2

void __thiscall KVStore::~KVStore(KVStore *this)

{
  SkipList *this_00;
  string *__lhs;
  int __val;
  uint64_t timeStamp;
  bool bVar1;
  unsigned_long uVar2;
  SSTableCache *pSVar3;
  _Base_ptr p_Var4;
  uint64_t in_RCX;
  string *psVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> fileName;
  undefined1 local_f0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (this->super_KVStoreAPI)._vptr_KVStoreAPI = (_func_int **)&PTR_put_00111d48;
  this_00 = &this->memTable;
  uVar2 = SkipList::getLength(this_00);
  if (uVar2 != 0) {
    __lhs = &this->storagePath;
    std::operator+(&local_50,__lhs,"/level-0");
    bVar1 = utils::dirExists(&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    if (!bVar1) {
      psVar5 = __lhs;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f0,
                     __lhs,"/level-0");
      utils::mkdir((char *)local_f0._0_8_,(__mode_t)psVar5);
      std::__cxx11::string::~string((string *)local_f0);
    }
    std::operator+(&local_70,__lhs,"/level-0/");
    __val = this->fileNums;
    this->fileNums = __val + 1;
    std::__cxx11::to_string(&local_90,__val);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_f0 + 0x20),&local_70,&local_90);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_f0 + 0x20),".sst");
    std::__cxx11::string::~string((string *)(local_f0 + 0x20));
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_70);
    SSTable::toSSTable((SSTable *)this_00,(SkipList *)local_f0,(string *)this->timeStamp,in_RCX);
    pSVar3 = (SSTableCache *)operator_new(0x2858);
    timeStamp = this->timeStamp;
    std::__cxx11::string::string((string *)&local_b0,(string *)local_f0);
    SSTableCache::SSTableCache(pSVar3,this_00,timeStamp,&local_b0);
    local_d0._M_dataplus._M_p = (pointer)pSVar3;
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,SSTableCache*>,std::_Select1st<std::pair<std::__cxx11::string_const,SSTableCache*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,SSTableCache*>>>
    ::_M_emplace_unique<std::__cxx11::string&,SSTableCache*>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,SSTableCache*>,std::_Select1st<std::pair<std::__cxx11::string_const,SSTableCache*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,SSTableCache*>>>
                *)&this->cache,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f0,
               (SSTableCache **)(local_f0 + 0x20));
    std::__cxx11::string::~string((string *)&local_b0);
    compaction(this,0);
    std::__cxx11::string::~string((string *)local_f0);
  }
  for (p_Var4 = (this->cache)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var4 != &(this->cache)._M_t._M_impl.super__Rb_tree_header;
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
    pSVar3 = *(SSTableCache **)(p_Var4 + 2);
    if (pSVar3 != (SSTableCache *)0x0) {
      SSTableCache::~SSTableCache(pSVar3);
    }
    operator_delete(pSVar3,0x2858);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableCache_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableCache_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableCache_*>_>_>
  ::~_Rb_tree(&(this->cache)._M_t);
  SkipList::~SkipList(this_00);
  std::__cxx11::string::~string((string *)&this->storagePath);
  return;
}

Assistant:

KVStore::~KVStore() {
  if (memTable.getLength() > 0) {
    if (!utils::dirExists(storagePath + "/level-0"))
      utils::mkdir((storagePath + "/level-0").c_str());
    auto fileName = storagePath + "/level-0/" + to_string(fileNums++) + ".sst";
    SSTable::toSSTable(memTable, fileName, timeStamp);
    cache.emplace(fileName, new SSTableCache(memTable, timeStamp, fileName));
    compaction(0);
  }

  for (auto &c : cache) delete c.second;
}